

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

bitset_container_t * bitset_container_from_run(run_container_t *arr)

{
  uint uVar1;
  int iVar2;
  bitset_container_t *pbVar3;
  int *in_RDI;
  rle16_t vl;
  int rlepos;
  bitset_container_t *answer;
  int card;
  run_container_t *in_stack_ffffffffffffffd8;
  int local_1c;
  
  iVar2 = run_container_cardinality(in_stack_ffffffffffffffd8);
  pbVar3 = bitset_container_create();
  for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
    uVar1 = *(uint *)(*(long *)(in_RDI + 2) + (long)local_1c * 4);
    bitset_set_lenrange(pbVar3->words,uVar1 & 0xffff,uVar1 >> 0x10);
  }
  pbVar3->cardinality = iVar2;
  return pbVar3;
}

Assistant:

bitset_container_t *bitset_container_from_run(const run_container_t *arr) {
    int card = run_container_cardinality(arr);
    bitset_container_t *answer = bitset_container_create();
    for (int rlepos = 0; rlepos < arr->n_runs; ++rlepos) {
        rle16_t vl = arr->runs[rlepos];
        bitset_set_lenrange(answer->words, vl.value, vl.length);
    }
    answer->cardinality = card;
    return answer;
}